

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

Result __thiscall
testing::internal::
FunctionMocker<std::optional<unsigned_int>_(const_solitaire::geometry::Position_&)>::Invoke
          (FunctionMocker<std::optional<unsigned_int>_(const_solitaire::geometry::Position_&)> *this
          ,Position *args)

{
  _Optional_payload_base<unsigned_int> _Var1;
  UntypedActionResultHolderBase *f;
  ActionResultHolder<std::optional<unsigned_int>_> *pAVar2;
  ArgumentTuple tuple;
  Position *local_10;
  
  local_10 = args;
  f = UntypedFunctionMockerBase::UntypedInvokeWith(&this->super_UntypedFunctionMockerBase,&local_10)
  ;
  pAVar2 = DownCast_<testing::internal::ActionResultHolder<std::optional<unsigned_int>>*,testing::internal::UntypedActionResultHolderBase>
                     (f);
  _Var1 = (pAVar2->result_).value_.super__Optional_base<unsigned_int,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_int>;
  (*(pAVar2->super_UntypedActionResultHolderBase)._vptr_UntypedActionResultHolderBase[1])(pAVar2);
  return (Result)_Var1;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
    ArgumentTuple tuple(std::forward<Args>(args)...);
    std::unique_ptr<ResultHolder> holder(DownCast_<ResultHolder*>(
        this->UntypedInvokeWith(static_cast<void*>(&tuple))));
    return holder->Unwrap();
  }